

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_failprob.c
# Opt level: O1

_Bool test_fprob(int K,int nTest)

{
  float fVar1;
  _Bool _Var2;
  uint uVar3;
  long lVar4;
  float fVar5;
  float local_40 [4];
  
  local_40[0] = -1.0;
  local_40[1] = -1.0;
  local_40[2] = -1.0;
  if (K == 100) {
    local_40[0] = 0.0039810715;
    local_40[1] = 0.0050118724;
  }
  _Var2 = true;
  lVar4 = 0;
  do {
    fVar5 = *(float *)((long)&DAT_001022dc + lVar4);
    fVar1 = *(float *)((long)local_40 + lVar4);
    printf("Running fixed loss tests. K=%d, nTest=%d, loss=%g.\n",(double)fVar5,K,nTest);
    uVar3 = zero_overhead_test(K,nTest,fVar5);
    if ((int)uVar3 < 0) {
      test_fprob_cold_1();
      _Var2 = false;
    }
    printf("--> %d failures out of %d runs.\n",(ulong)uVar3,nTest);
    if ((fVar1 != -1.0) || (NAN(fVar1))) {
      fVar5 = roundf(fVar1 * (float)nTest);
      printf("    expected would be ~%d.\n",(ulong)(uint)(int)fVar5);
    }
    fflush(_stdout);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  return _Var2;
}

Assistant:

bool test_fprob(int K, int nTest)
{
	bool success = true;

	/* Tests at fixed losses */
	float losses[] = { 0.1, 0.85, 1 };
	float expected_fps[3] = { -1, -1, -1 };
	if (K == 100) {
		/* Graphs in sect B.3.1 of the monograph were used to
		 * read off expected failure probabilities.
		 */
		expected_fps[0] = pow(10, -2.4); // from B.3.1
		expected_fps[1] = pow(10, -2.3); // from B.3.1
	}
	const int nLosses = (int)(sizeof(losses) / sizeof(losses[0]));
	for (int i = 0; i < nLosses; ++i) {
		const float loss = losses[i];
		const float expected_fp = expected_fps[i];
		printf("Running fixed loss tests. K=%d, nTest=%d, "
		  "loss=%g.\n", K, nTest, (double)loss);
		int nfail = zero_overhead_test(K, nTest, loss);
		if (nfail < 0) {
			fprintf(stderr, "Error:  random_esi_test() failed.\n");
			success = false;
		}
		printf("--> %d failures out of %d runs.\n", nfail, nTest);
		if (expected_fp != -1) {
			printf("    expected would be ~%d.\n",
				(int)round(expected_fp * nTest));
		}
		fflush(stdout);
	}

	return success;
}